

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLInstanceKinematicsModelLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::InstanceKinematicsModelLoader::begin__int(InstanceKinematicsModelLoader *this)

{
  KinematicsNewParam *this_00;
  String *in_RDI;
  ValueType in_stack_ffffffffffffffec;
  KinematicsNewParam *in_stack_fffffffffffffff0;
  
  this_00 = (KinematicsNewParam *)operator_new(0x38);
  KinematicsNewParam::KinematicsNewParam(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  *(KinematicsNewParam **)&in_RDI->field_2 = this_00;
  KinematicsNewParam::setName(this_00,in_RDI);
  return true;
}

Assistant:

bool InstanceKinematicsModelLoader::begin__int()
	{
		mCurrentKinematicsNewParam = new KinematicsNewParam(KinematicsNewParam::VALUETYPE_INT);
		mCurrentKinematicsNewParam->setName(mCurrentKinematicsNewParamSid);
		return true;
	}